

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O2

void __thiscall
CombinedSeismogramm<float,_3>::Save
          (CombinedSeismogramm<float,_3> *this,SeismoType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  pointer pSVar1;
  float *pfVar2;
  pointer pfVar3;
  long *plVar4;
  long lVar5;
  uint uVar6;
  ostream *poVar7;
  pointer pbVar8;
  pointer pbVar9;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int j;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  ofstream outf_res;
  ofstream outf_expl;
  ofstream outf;
  
  if (type == CSV) {
    if ((ulong)((((long)(this->seismogramms).
                        super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->seismogramms).
                       super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x1c0) * 3) <
        (ulong)(((long)(paths->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(paths->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5) * 3)) {
      pcVar10 = "Too many Csv files to save!";
LAB_0010b87e:
      poVar7 = std::operator<<((ostream *)&std::cout,pcVar10);
      std::endl<char,std::char_traits<char>>(poVar7);
      exit(1);
    }
    pfVar2 = (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    interpolate_data_on_equal_time_intervals
              (this,((pfVar3[-1] - *pfVar2) / (float)(((long)pfVar3 - (long)pfVar2 >> 2) - 1)) *
                    this->interpolation_multiplier);
    uVar14 = 0;
    while( true ) {
      uVar15 = (ulong)uVar14;
      pbVar8 = (paths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(paths->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar15)
      break;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outf_res,
                     pbVar8 + uVar15,".csv");
      std::ofstream::ofstream((ostream *)&outf,_outf_res,_S_out);
      std::__cxx11::string::~string((string *)&outf_res);
      std::operator<<((ostream *)&outf,"Time;");
      uVar12 = 0;
      while (pSVar1 = (this->seismogramms).
                      super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
            uVar12 < (ulong)(((long)*(pointer *)
                                     ((long)&(pSVar1->data).
                                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                             ._M_impl + 8) -
                             *(long *)&(pSVar1->data).
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl) / 0x18)) {
        poVar7 = std::operator<<((ostream *)&outf,"Vx (edge = ");
        uVar12 = uVar12 + 1;
        iVar11 = (int)uVar12;
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
        std::operator<<(poVar7,");");
        poVar7 = std::operator<<((ostream *)&outf,"Vy (edge = ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
        std::operator<<(poVar7,");");
        poVar7 = std::operator<<((ostream *)&outf,"Vz (edge = ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
        std::operator<<(poVar7,");");
      }
      std::operator<<((ostream *)&outf,"\n");
      uVar6 = uVar14 * 3;
      for (uVar12 = 0;
          plVar4 = *(long **)&(this->seismogramms).
                              super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar6].data.
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl, uVar12 < (ulong)(plVar4[1] - *plVar4 >> 2);
          uVar12 = uVar12 + 1) {
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&outf,
                            (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar12]);
        std::operator<<(poVar7,";");
        lVar13 = 0;
        for (uVar16 = 0;
            pSVar1 = (this->seismogramms).
                     super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start,
            lVar5 = *(long *)&pSVar1[uVar6].data.
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl,
            uVar16 < (ulong)(((long)*(pointer *)
                                     ((long)&pSVar1[uVar6].data.
                                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                             ._M_impl + 8) - lVar5) / 0x18); uVar16 = uVar16 + 1) {
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&outf,*(float *)(*(long *)(lVar5 + lVar13) + uVar12 * 4));
          std::operator<<(poVar7,";");
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&outf,
                              *(float *)(*(long *)(*(long *)&(this->seismogramms).
                                                                                                                          
                                                  super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar14 * 3 + 1].data.
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl + lVar13) + uVar12 * 4));
          std::operator<<(poVar7,";");
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&outf,
                              *(float *)(*(long *)(*(long *)&(this->seismogramms).
                                                                                                                          
                                                  super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar14 * 3 + 2].data.
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl + lVar13) + uVar12 * 4));
          std::operator<<(poVar7,";");
          lVar13 = lVar13 + 0x18;
        }
        std::operator<<((ostream *)&outf,"\n");
      }
      std::ofstream::close();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outf_expl
                     ,(paths->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar15,".rec.txt");
      std::ofstream::ofstream(&outf_res,_outf_expl,_S_out);
      std::__cxx11::string::~string((string *)&outf_expl);
      for (uVar12 = 0;
          pSVar1 = (this->seismogramms).
                   super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)(((long)*(pointer *)
                                   ((long)&pSVar1[uVar6].trace_header_data.
                                           super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>
                                           ._M_impl + 8) -
                           *(long *)&pSVar1[uVar6].trace_header_data.
                                     super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>
                                     ._M_impl) / 0xf0); uVar12 = uVar12 + 1) {
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&outf_res);
        poVar7 = std::operator<<(poVar7," ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::operator<<(poVar7,"\n");
      }
      std::ofstream::close();
      std::operator+(&local_650,
                     (paths->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar15,".expl.txt");
      std::ofstream::ofstream(&outf_expl,local_650._M_dataplus._M_p,_S_out);
      std::__cxx11::string::~string((string *)&local_650);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&outf_expl);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::operator<<(poVar7,"\n");
      std::ofstream::close();
      std::ofstream::~ofstream(&outf_expl);
      std::ofstream::~ofstream(&outf_res);
      std::ofstream::~ofstream((ostream *)&outf);
      uVar14 = uVar14 + 1;
    }
  }
  else if (type == SEG_Y) {
    pbVar8 = (paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar9 = (paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)(this->seismogramms).
                       super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->seismogramms).
                      super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x1c0) <
        (ulong)((long)pbVar9 - (long)pbVar8 >> 5)) {
      pcVar10 = "Too many Seg-Y files to save!";
      goto LAB_0010b87e;
    }
    for (uVar14 = 0; uVar15 = (ulong)uVar14, uVar15 < (ulong)((long)pbVar9 - (long)pbVar8 >> 5);
        uVar14 = uVar14 + 1) {
      pSVar1 = (this->seismogramms).
               super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&outf,pbVar8[uVar15]._M_dataplus._M_p,(allocator<char> *)&outf_res);
      Seismogramm<float>::SaveSegY(pSVar1 + uVar15,(string *)&outf,&this->times,false);
      std::__cxx11::string::~string((string *)&outf);
      pbVar8 = (paths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar9 = (paths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return;
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::Save(SeismoType type, std::vector<std::string> paths)
{
    if (type == SEG_Y)
    {
        if (paths.size()> seismogramms.size())
        {
            std::cout << "Too many Seg-Y files to save!" << std::endl;
            std::exit(1);
        }
        for (IndexType i = 0; i < paths.size(); ++i)
        {
            seismogramms[i].SaveSegY(paths[i].data(), times);
        }
    }
    else if (type == CSV)
    {
        if (paths.size() * dims > 3 * seismogramms.size())
        {
            std::cout << "Too many Csv files to save!" << std::endl;
            std::exit(1);
        }

        Scalar interval = (times.back() - times.front()) / (times.size() - 1);
        interpolate_data_on_equal_time_intervals(interval * interpolation_multiplier);
        interval = times[1] - times[0];

        for (IndexType path_index = 0; path_index < paths.size(); path_index++)
        {
            // Saving data
            std::ofstream outf ((paths[path_index] + ".csv").c_str(), std::ios::out);
            outf << "Time;";
            for (int i = 0; i < seismogramms[0].data.size(); i++)
            {
                outf << "Vx (edge = " << i + 1 << ");";
                outf << "Vy (edge = " << i + 1 << ");";
                if (dims >= 3)
                    outf << "Vz (edge = " << i + 1 << ");";
            }
            outf << "\n";
            for (int i = 0; i < seismogramms[dims*path_index].data[0].size(); i++)
            {
                outf << times[i] << ";";
                for (int j = 0; j < seismogramms[dims*path_index].data.size(); j++)
                {
                    outf << seismogramms[dims*path_index + 0].data[j][i] << ";";
                    outf << seismogramms[dims*path_index + 1].data[j][i] << ";";
                    if (dims >= 3)
                        outf << seismogramms[dims*path_index + 2].data[j][i] << ";";
                }
                outf << "\n";
            }
            outf.close();
            // Saving receivers
            std::ofstream outf_res ((paths[path_index] + ".rec.txt").c_str(), std::ios::out);
            for (int i = 0; i < seismogramms[dims*path_index].trace_header_data.size(); i++)
            {
                outf_res << seismogramms[dims*path_index].trace_header_data[i].receiver_x << " " <<
                            seismogramms[dims*path_index].trace_header_data[i].receiver_y << "\n";
            }
            outf_res.close();
            // Saving explosion coords
            std::ofstream outf_expl ((paths[path_index] + ".expl.txt").c_str(), std::ios::out);
            outf_expl << seismogramms[dims*path_index].trace_header_data[0].source_x << " " <<
                         seismogramms[dims*path_index].trace_header_data[0].source_y << "\n";
            outf_expl.close();
        }
    }
}